

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          handler_type2 *handler)

{
  mutex *__mutex;
  
  __mutex = &this->lock_;
  std::mutex::lock(__mutex);
  if (this->has_result_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::
    function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
    ::operator()(handler,this,&this->err_);
    return;
  }
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::operator=(&this->handler2_,handler);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void when_ready(const handler_type2& handler) {
        bool call_handler = false;
        {   std::lock_guard<std::mutex> guard(lock_);
            if (has_result_) call_handler = true;
            else handler2_ = handler;
        }
        if (call_handler) handler(*this, err_);
    }